

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_impl.hpp
# Opt level: O3

string * __thiscall
toml::to_string_abi_cxx11_(string *__return_storage_ptr__,toml *this,integer_format c)

{
  ostringstream oss;
  byte local_189;
  undefined1 local_188 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
  if ((byte)this < 4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_188,
               &DAT_00455b00 + *(int *)(&DAT_00455b00 + ((ulong)this & 0xff) * 4),3);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_188,"unknown integer_format: ",0x18);
    local_189 = (byte)this;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,(char *)&local_189,1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
  std::ios_base::~ios_base((ios_base *)(local_188 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE std::string to_string(const integer_format c)
{
    std::ostringstream oss;
    oss << c;
    return oss.str();
}